

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void cloudClearMark(CloudManager *dd,CloudNode *n)

{
  CloudNode *n_local;
  CloudManager *dd_local;
  
  if (((n->v & 0x10000000) != 0) && (n->v = n->v & 0xefffffff, (n->v & 0xefffffff) != 0xfffffff)) {
    cloudClearMark(dd,n->t);
    cloudClearMark(dd,(CloudNode *)((ulong)n->e & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

static void cloudClearMark( CloudManager * dd, CloudNode * n )
{
    if ( !cloudNodeIsMarked(n) )
        return;
    // clear visited flag
    cloudNodeUnmark(n);
    if ( cloudIsConstant(n) )
        return;
    cloudClearMark( dd, cloudT(n) );
    cloudClearMark( dd, Cloud_Regular(cloudE(n)) );
}